

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator.h
# Opt level: O0

void __thiscall flatbuffers::CodeGenerator::~CodeGenerator(CodeGenerator *this)

{
  CodeGenerator *this_local;
  
  this->_vptr_CodeGenerator = (_func_int **)&PTR__CodeGenerator_001fdd08;
  std::__cxx11::string::~string((string *)&this->status_detail);
  return;
}

Assistant:

virtual ~CodeGenerator() = default;